

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

double __thiscall nonius::html_reporter::ideal_magnitude(html_reporter *this)

{
  double dVar1;
  pointer prVar2;
  duration<double,_std::ratio<1L,_1L>_> *pdVar3;
  duration<double,_std::ratio<1L,_1L>_> *pdVar4;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  __result;
  _Hash_node_base *p_Var5;
  pointer prVar6;
  rep rVar7;
  double dVar8;
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  mins;
  value_type d;
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  local_108;
  double local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
  local_e0;
  
  local_108.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (duration<double,_std::ratio<1L,_1L>_> *)0x0;
  local_108.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (duration<double,_std::ratio<1L,_1L>_> *)0x0;
  local_108.
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (duration<double,_std::ratio<1L,_1L>_> *)0x0;
  prVar6 = (this->runs).
           super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::reserve(&local_108,
            ((long)(this->runs).
                   super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)prVar6 >> 4) *
            (prVar6->data)._M_h._M_element_count * 0x6db6db6db6db6db7);
  prVar6 = (this->runs).
           super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar2 = (this->runs).
           super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar6 != prVar2) {
    do {
      for (p_Var5 = (prVar6->data)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
          p_Var5 = p_Var5->_M_nxt) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
        ::pair(&local_e0,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
                *)(p_Var5 + 1));
        pdVar3 = local_e0.second.samples.
                 super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
        pdVar4 = local_e0.second.samples.
                 super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pdVar3 != local_e0.second.samples.
                      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish &&
            local_e0.second.samples.
            super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_e0.second.samples.
            super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          rVar7 = (local_e0.second.samples.
                   super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->__r;
          do {
            dVar8 = pdVar3->__r;
            if (dVar8 < rVar7) {
              pdVar4 = pdVar3;
            }
            if (dVar8 <= rVar7) {
              rVar7 = dVar8;
            }
            pdVar3 = pdVar3 + 1;
          } while (pdVar3 != local_e0.second.samples.
                             super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_108.
            super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_108.
            super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>
          ::_M_realloc_insert<std::chrono::duration<double,std::ratio<1l,1l>>const&>
                    ((vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>
                      *)&local_108,
                     (iterator)
                     local_108.
                     super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,pdVar4);
        }
        else {
          (local_108.
           super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->__r = pdVar4->__r;
          local_108.
          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_108.
               super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_e0.second.analysis.samples.
            super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.second.analysis.samples.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.second.analysis.samples.
                                super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.second.analysis.samples.
                                super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e0.second.samples.
            super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (duration<double,_std::ratio<1L,_1L>_> *)0x0) {
          operator_delete(local_e0.second.samples.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.second.samples.
                                super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.second.samples.
                                super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      prVar6 = prVar6 + 1;
    } while (prVar6 != prVar2);
  }
  pdVar4 = local_108.
           super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  pdVar3 = local_108.
           super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar4 != local_108.
                super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish &&
      local_108.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    dVar8 = (local_108.
             super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->__r;
    do {
      dVar1 = pdVar4->__r;
      if (dVar1 < dVar8) {
        pdVar3 = pdVar4;
      }
      if (dVar1 <= dVar8) {
        dVar8 = dVar1;
      }
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != local_108.
                       super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  dVar8 = pdVar3->__r;
  if (2.0 <= dVar8) {
    local_e8 = 1.0;
  }
  else if (0.002 <= dVar8) {
    local_e8 = 1000.0;
  }
  else {
    local_e8 = *(double *)(&DAT_0016c2e0 + (ulong)(dVar8 < 2e-06) * 8);
  }
  if (local_108.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (duration<double,_std::ratio<1L,_1L>_> *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_e8;
}

Assistant:

double ideal_magnitude() const {
            std::vector<fp_seconds> mins;
            mins.reserve(runs.size() * runs.front().data.size());
            for (auto&& r : runs) {
                for(auto d : r.data) {
                    mins.push_back(*std::min_element(d.second.samples.begin(), d.second.samples.end()));
                }
            }
            auto min = *std::min_element(mins.begin(), mins.end());
            return detail::get_magnitude(min);
        }